

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarModel::setRange(QCalendarModel *this,QDate min,QDate max)

{
  long lVar1;
  bool bVar2;
  qint64 in_RDX;
  qint64 in_RSI;
  QDate *in_RDI;
  long in_FS_OFFSET;
  QDate *value1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI[5].jd = in_RSI;
  in_RDI[6].jd = in_RDX;
  value1 = in_RDI;
  bVar2 = operator>(in_RDI,in_RDI);
  if (bVar2) {
    qSwap<QDate>(value1,in_RDI);
  }
  bVar2 = ::operator<(value1,in_RDI);
  if (bVar2) {
    in_RDI[4].jd = in_RDI[5].jd;
  }
  bVar2 = operator>(value1,in_RDI);
  if (bVar2) {
    in_RDI[4].jd = in_RDI[6].jd;
  }
  internalUpdate((QCalendarModel *)min.jd);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarModel::setRange(QDate min, QDate max)
{
    m_minimumDate = min;
    m_maximumDate = max;
    if (m_minimumDate > m_maximumDate)
        qSwap(m_minimumDate, m_maximumDate);
    if (m_date < m_minimumDate)
        m_date = m_minimumDate;
    if (m_date > m_maximumDate)
        m_date = m_maximumDate;
    internalUpdate();
}